

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

void __thiscall rtb::Filter::Filter<double>::resetState(Filter<double> *this)

{
  bool bVar1;
  reference pcVar2;
  complex<double> *element_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__range2_1;
  complex<double> *element;
  iterator __end0;
  iterator __begin0;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__range2;
  Filter<double> *this_local;
  
  __end0 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                     (&this->x_);
  element = (complex<double> *)
            std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
                      (&this->x_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                                *)&element);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
             ::operator*(&__end0);
    std::complex<double>::operator=(pcVar2,0.0);
    __gnu_cxx::
    __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
    ::operator++(&__end0);
  }
  __end0_1 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                       (&this->y_);
  element_1 = (complex<double> *)
              std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
                        (&this->y_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0_1,
                       (__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                        *)&element_1);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
             ::operator*(&__end0_1);
    std::complex<double>::operator=(pcVar2,0.0);
    __gnu_cxx::
    __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
    ::operator++(&__end0_1);
  }
  this->count_ = 0;
  return;
}

Assistant:

void Filter<T>::resetState() {
            for (auto& element : x_)
                element = 0;
            for (auto& element : y_)
                element = 0;

            count_ = 0;
        }